

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

void hd_context_shrink_table_size(nghttp2_hd_context *context,nghttp2_hd_map *map)

{
  nghttp2_mem *mem;
  size_t sVar1;
  nghttp2_hd_entry *pnVar2;
  uint uVar3;
  nghttp2_hd_entry *ptr;
  nghttp2_hd_entry **ppnVar4;
  nghttp2_hd_entry *pnVar5;
  nghttp2_rcbuf *rcbuf;
  
  if (context->hd_table_bufsize_max < context->hd_table_bufsize) {
    mem = context->mem;
    do {
      sVar1 = (context->hd_table).len;
      if (sVar1 == 0) {
        return;
      }
      ptr = hd_ringbuf_get(&context->hd_table,sVar1 - 1);
      rcbuf = (ptr->nv).value;
      sVar1 = (context->hd_table).len;
      context->hd_table_bufsize =
           (context->hd_table_bufsize - (((ptr->nv).name)->len + rcbuf->len)) - 0x20;
      if (sVar1 == 0) {
        __assert_fail("ringbuf->len > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_hd.c"
                      ,0x29e,"void hd_ringbuf_pop_back(nghttp2_hd_ringbuf *)");
      }
      (context->hd_table).len = sVar1 - 1;
      if (map != (nghttp2_hd_map *)0x0) {
        uVar3 = ptr->hash & 0x7f;
        pnVar2 = map->table[uVar3];
        if (pnVar2 != (nghttp2_hd_entry *)0x0) {
          if (pnVar2 == ptr) {
            ppnVar4 = map->table + uVar3;
          }
          else {
            do {
              pnVar5 = pnVar2;
              pnVar2 = pnVar5->next;
              if (pnVar2 == (nghttp2_hd_entry *)0x0) goto LAB_006c6b93;
            } while (pnVar2 != ptr);
            ppnVar4 = &pnVar5->next;
          }
          *ppnVar4 = ptr->next;
          ptr->next = (nghttp2_hd_entry *)0x0;
          rcbuf = (ptr->nv).value;
        }
      }
LAB_006c6b93:
      nghttp2_rcbuf_decref(rcbuf);
      nghttp2_rcbuf_decref((ptr->nv).name);
      nghttp2_mem_free(mem,ptr);
    } while (context->hd_table_bufsize_max < context->hd_table_bufsize);
  }
  return;
}

Assistant:

static void hd_context_shrink_table_size(nghttp2_hd_context *context,
                                         nghttp2_hd_map *map) {
  nghttp2_mem *mem;

  mem = context->mem;

  while (context->hd_table_bufsize > context->hd_table_bufsize_max &&
         context->hd_table.len > 0) {
    size_t idx = context->hd_table.len - 1;
    nghttp2_hd_entry *ent = hd_ringbuf_get(&context->hd_table, idx);
    context->hd_table_bufsize -=
        entry_room(ent->nv.name->len, ent->nv.value->len);
    hd_ringbuf_pop_back(&context->hd_table);
    if (map) {
      hd_map_remove(map, ent);
    }

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }
}